

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,PrintLabelFlag print_label_flag,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  Syntax SVar2;
  Label LVar3;
  Type TVar4;
  FileDescriptor *this_00;
  Descriptor *pDVar5;
  FieldOptions *options;
  string *psVar6;
  SourceLocationCommentPrinter *in_RCX;
  int in_EDX;
  int in_ESI;
  FieldDescriptor *in_RDI;
  long in_R8;
  string formatted_options;
  bool bracketed;
  SourceLocationCommentPrinter comment_printer;
  string label;
  bool print_label;
  string field_type;
  string prefix;
  undefined1 in_stack_00000fd7;
  DebugStringOptions *in_stack_00000fd8;
  string *in_stack_00000fe0;
  int in_stack_00000fec;
  Descriptor *in_stack_00000ff0;
  SubstituteArg *in_stack_fffffffffffff738;
  int value;
  SubstituteArg *in_stack_fffffffffffff740;
  SourceLocationCommentPrinter *this_01;
  SubstituteArg *in_stack_fffffffffffff750;
  SubstituteArg *this_02;
  string *in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  string *in_stack_fffffffffffff778;
  SourceLocationCommentPrinter *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7a8;
  SourceLocationCommentPrinter *in_stack_fffffffffffff7b0;
  SourceLocationCommentPrinter *pSVar7;
  int depth_00;
  string local_7a0 [32];
  string local_780 [32];
  SubstituteArg local_760;
  SubstituteArg local_730;
  SubstituteArg local_700;
  SubstituteArg local_6d0;
  char in_stack_fffffffffffff987;
  undefined8 in_stack_fffffffffffff988;
  SubstituteArg *in_stack_fffffffffffff9b8;
  SubstituteArg *in_stack_fffffffffffff9c0;
  SubstituteArg *in_stack_fffffffffffff9c8;
  SubstituteArg *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9d8;
  string *in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9f0;
  SubstituteArg *in_stack_fffffffffffff9f8;
  SubstituteArg *in_stack_fffffffffffffa00;
  SubstituteArg *in_stack_fffffffffffffa08;
  SubstituteArg *in_stack_fffffffffffffa10;
  SubstituteArg *in_stack_fffffffffffffa18;
  SubstituteArg local_5e0;
  string local_5b0 [87];
  byte local_559;
  SubstituteArg local_558;
  SubstituteArg local_528;
  SubstituteArg local_4f8;
  SubstituteArg local_4c8;
  SourceLocationCommentPrinter local_498 [2];
  string local_2e0 [39];
  byte local_2b9;
  string local_2b8 [32];
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  string local_118 [80];
  string local_c8 [80];
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  long local_20;
  SourceLocationCommentPrinter *local_18;
  int local_10;
  int local_c;
  
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(long)(in_ESI * 2),' ',&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::string(local_78);
  bVar1 = is_map((FieldDescriptor *)in_stack_fffffffffffff740);
  if (bVar1) {
    pDVar5 = message_type((FieldDescriptor *)in_stack_fffffffffffff740);
    Descriptor::field(pDVar5,0);
    FieldTypeNameDebugString_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff778);
    strings::internal::SubstituteArg::SubstituteArg
              (in_stack_fffffffffffff740,(string *)in_stack_fffffffffffff738);
    pDVar5 = message_type((FieldDescriptor *)in_stack_fffffffffffff740);
    Descriptor::field(pDVar5,1);
    FieldTypeNameDebugString_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff778);
    strings::internal::SubstituteArg::SubstituteArg
              (in_stack_fffffffffffff740,(string *)in_stack_fffffffffffff738);
    strings::internal::SubstituteArg::SubstituteArg(&local_148);
    strings::internal::SubstituteArg::SubstituteArg(&local_178);
    strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_208);
    strings::internal::SubstituteArg::SubstituteArg(&local_238);
    strings::internal::SubstituteArg::SubstituteArg(&local_268);
    strings::internal::SubstituteArg::SubstituteArg(&local_298);
    in_stack_fffffffffffff750 = &local_238;
    in_stack_fffffffffffff740 = &local_1d8;
    in_stack_fffffffffffff738 = &local_1a8;
    strings::SubstituteAndAppend
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (SubstituteArg *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8,
               in_stack_fffffffffffffa00,in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,
               in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_c8);
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffff778);
    std::__cxx11::string::operator=(local_78,local_2b8);
    std::__cxx11::string::~string(local_2b8);
  }
  local_2b9 = 1;
  bVar1 = is_optional((FieldDescriptor *)0x4bb755);
  if (bVar1) {
    if (local_10 != 1) {
      this_00 = file(in_RDI);
      SVar2 = FileDescriptor::syntax(this_00);
      if (SVar2 != SYNTAX_PROTO3) goto LAB_004bb7b8;
    }
    local_2b9 = 0;
  }
  else {
LAB_004bb7b8:
    bVar1 = is_map((FieldDescriptor *)in_stack_fffffffffffff740);
    if (bVar1) {
      local_2b9 = 0;
    }
  }
  std::__cxx11::string::string(local_2e0);
  if ((local_2b9 & 1) != 0) {
    LVar3 = FieldDescriptor::label(in_RDI);
    std::__cxx11::string::operator=(local_2e0,*(char **)(kLabelToName + (ulong)LVar3 * 8));
    std::__cxx11::string::push_back((char)local_2e0);
  }
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FieldDescriptor>
            (in_stack_fffffffffffff780,(FieldDescriptor *)in_stack_fffffffffffff778,
             (string *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770),
             (DebugStringOptions *)in_stack_fffffffffffff768);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  depth_00 = (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffff740,(string *)in_stack_fffffffffffff738);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffff740,(string *)in_stack_fffffffffffff738);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffff740,(string *)in_stack_fffffffffffff738);
  TVar4 = type((FieldDescriptor *)in_stack_fffffffffffff750);
  if (TVar4 == TYPE_GROUP) {
    pDVar5 = message_type((FieldDescriptor *)in_stack_fffffffffffff740);
    Descriptor::name_abi_cxx11_(pDVar5);
  }
  else {
    name_abi_cxx11_(in_RDI);
  }
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffff740,(string *)in_stack_fffffffffffff738);
  value = (int)((ulong)in_stack_fffffffffffff738 >> 0x20);
  number(in_RDI);
  strings::internal::SubstituteArg::SubstituteArg(in_stack_fffffffffffff740,value);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_498);
  strings::internal::SubstituteArg::SubstituteArg(&local_4c8);
  strings::internal::SubstituteArg::SubstituteArg(&local_4f8);
  strings::internal::SubstituteArg::SubstituteArg(&local_528);
  strings::internal::SubstituteArg::SubstituteArg(&local_558);
  this_02 = &local_4f8;
  this_01 = local_498;
  psVar6 = (string *)((long)&local_498[0].source_loc_.leading_comments.field_2 + 8);
  strings::SubstituteAndAppend
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
             (SubstituteArg *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8,
             in_stack_fffffffffffffa00,in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,
             in_stack_fffffffffffffa18);
  local_559 = 0;
  bVar1 = has_default_value(in_RDI);
  if (bVar1) {
    local_559 = 1;
    DefaultValueAsString_abi_cxx11_
              ((FieldDescriptor *)in_stack_fffffffffffff988,(bool)in_stack_fffffffffffff987);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01,psVar6);
    strings::internal::SubstituteArg::SubstituteArg(&local_5e0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff9f0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff9c0);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff990);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff960);
    strings::internal::SubstituteArg::SubstituteArg(&local_6d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_700);
    strings::internal::SubstituteArg::SubstituteArg(&local_730);
    strings::internal::SubstituteArg::SubstituteArg(&local_760);
    this_02 = &local_700;
    this_01 = (SourceLocationCommentPrinter *)&stack0xfffffffffffff960;
    strings::SubstituteAndAppend
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
               (SubstituteArg *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8,
               in_stack_fffffffffffffa00,in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,
               in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_5b0);
  }
  if (((byte)in_RDI[0x41] & 1) != 0) {
    if ((local_559 & 1) == 0) {
      local_559 = 1;
      std::__cxx11::string::append(&local_18->have_source_loc_);
    }
    else {
      std::__cxx11::string::append(&local_18->have_source_loc_);
    }
    std::__cxx11::string::append(&local_18->have_source_loc_);
    pSVar7 = local_18;
    json_name_abi_cxx11_(in_RDI);
    CEscape(in_stack_fffffffffffff768);
    std::__cxx11::string::append((string *)pSVar7);
    depth_00 = (int)((ulong)pSVar7 >> 0x20);
    std::__cxx11::string::~string(local_780);
    std::__cxx11::string::append(&local_18->have_source_loc_);
  }
  std::__cxx11::string::string(local_7a0);
  options = FieldDescriptor::options(in_RDI);
  psVar6 = (string *)file(in_RDI);
  FileDescriptor::pool((FileDescriptor *)psVar6);
  bVar1 = anon_unknown_1::FormatBracketedOptions
                    (depth_00,&options->super_Message,
                     (DescriptorPool *)CONCAT44(local_c,in_stack_fffffffffffff7a0),psVar6);
  if (bVar1) {
    if ((local_559 & 1) == 0) {
      in_stack_fffffffffffff778 = (string *)0x6413a0;
    }
    else {
      in_stack_fffffffffffff778 = (string *)0x71d909;
    }
    in_stack_fffffffffffff780 = local_18;
    std::__cxx11::string::append(&local_18->have_source_loc_);
    local_559 = 1;
    std::__cxx11::string::append((string *)local_18);
  }
  if ((local_559 & 1) != 0) {
    std::__cxx11::string::append(&local_18->have_source_loc_);
  }
  TVar4 = type((FieldDescriptor *)this_02);
  if (TVar4 == TYPE_GROUP) {
    if ((*(byte *)(local_20 + 1) & 1) == 0) {
      message_type((FieldDescriptor *)this_01);
      Descriptor::DebugString
                (in_stack_00000ff0,in_stack_00000fec,in_stack_00000fe0,in_stack_00000fd8,
                 (bool)in_stack_00000fd7);
    }
    else {
      std::__cxx11::string::append(&local_18->have_source_loc_);
    }
  }
  else {
    std::__cxx11::string::append(&local_18->have_source_loc_);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  std::__cxx11::string::~string(local_7a0);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_01);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void FieldDescriptor::DebugString(
    int depth, PrintLabelFlag print_label_flag, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  std::string field_type;

  // Special case map fields.
  if (is_map()) {
    strings::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  bool print_label = true;
  // Determine whether to omit label:
  //   1. For an optional field, omit label if it's in oneof or in proto3.
  //   2. For a repeated field, omit label if it's a map.
  if (is_optional() && (print_label_flag == OMIT_LABEL ||
                        file()->syntax() == FileDescriptor::SYNTAX_PROTO3)) {
    print_label = false;
  } else if (is_map()) {
    print_label = false;
  }
  std::string label;
  if (print_label) {
    label = kLabelToName[this->label()];
    label.push_back(' ');
  }

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(
      contents, "$0$1$2 $3 = $4", prefix, label, field_type,
      type() == TYPE_GROUP ? message_type()->name() : name(), number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append("[");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(CEscape(json_name()));
    contents->append("\"");
  }

  std::string formatted_options;
  if (FormatBracketedOptions(depth, options(), file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}